

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_SetSpecial(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  long lVar1;
  long *plVar2;
  
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->special = arg1;
      it->args[0] = arg2;
      it->args[1] = arg3;
      it->args[2] = arg4;
    }
  }
  else {
    lVar1 = 0;
    while( true ) {
      plVar2 = (long *)(lVar1 + 0x288);
      if (lVar1 == 0) {
        plVar2 = (long *)((long)AActor::TIDHash + (ulong)((arg0 & 0x7fU) << 3));
      }
      for (lVar1 = *plVar2; (lVar1 != 0 && (*(int *)(lVar1 + 0x260) != arg0));
          lVar1 = *(long *)(lVar1 + 0x288)) {
      }
      if (lVar1 == 0) break;
      *(int *)(lVar1 + 0x264) = arg1;
      *(int *)(lVar1 + 0x268) = arg2;
      *(int *)(lVar1 + 0x26c) = arg3;
      *(int *)(lVar1 + 0x270) = arg4;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetSpecial)	// [BC]
// Thing_SetSpecial (tid, special, arg1, arg2, arg3)
// [RH] Use the SetThingSpecial ACS command instead.
// It can set all args and not just the first three.
{
	if (arg0 == 0)
	{
		if (it != NULL)
		{
			it->special = arg1;
			it->args[0] = arg2;
			it->args[1] = arg3;
			it->args[2] = arg4;
		}
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (arg0);

		while ( (actor = iterator.Next ()) )
		{
			actor->special = arg1;
			actor->args[0] = arg2;
			actor->args[1] = arg3;
			actor->args[2] = arg4;
		}
	}
	return true;
}